

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

error_code __thiscall
anon_unknown.dwarf_60e82::FilteredDirectoryContentsTask::getFilteredContents
          (FilteredDirectoryContentsTask *this,StringRef path,StringList *filters,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  bool bVar1;
  bool bVar2;
  MATCH_RESULT MVar3;
  directory_entry *this_00;
  undefined8 uVar4;
  reference pSVar5;
  char *pcVar6;
  directory_iterator *pdVar7;
  iterator iVar8;
  iterator iVar9;
  error_code eVar10;
  byte local_182;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  char *local_120;
  StringRef pattern;
  iterator __end3;
  iterator __begin3;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range3;
  undefined1 auStack_f0 [7];
  bool excluded;
  undefined8 local_e8;
  StringRef local_e0;
  undefined1 local_d0 [8];
  string filename;
  directory_iterator end;
  undefined1 local_80 [8];
  directory_iterator it;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filterStrings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames_local;
  StringList *filters_local;
  StringRef path_local;
  error_code ec;
  
  path_local.Data = path.Data;
  filters_local = (StringList *)this;
  llbuild::basic::StringList::getValues
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&it.FollowSymlinks,
             (StringList *)path.Length);
  std::error_code::error_code((error_code *)&path_local.Length);
  llvm::Twine::Twine((Twine *)&end.FollowSymlinks,(StringRef *)&filters_local);
  llvm::sys::fs::directory_iterator::directory_iterator
            ((directory_iterator *)local_80,(Twine *)&end.FollowSymlinks,
             (error_code *)&path_local.Length,true);
  memset((void *)((long)&filename.field_2 + 8),0,0x18);
  llvm::sys::fs::directory_iterator::directory_iterator
            ((directory_iterator *)((long)&filename.field_2 + 8));
  do {
    bVar1 = llvm::sys::fs::directory_iterator::operator!=
                      ((directory_iterator *)local_80,
                       (directory_iterator *)((long)&filename.field_2 + 8));
    local_182 = 0;
    if (bVar1) {
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)&path_local.Length);
      local_182 = bVar1 ^ 0xff;
    }
    if ((local_182 & 1) == 0) {
      llvm::sys::fs::directory_iterator::~directory_iterator
                ((directory_iterator *)((long)&filename.field_2 + 8));
      llvm::sys::fs::directory_iterator::~directory_iterator((directory_iterator *)local_80);
      iVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)filters);
      iVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)filters);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>
                (iVar8._M_current,iVar9._M_current);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&it.FollowSymlinks);
      eVar10._4_4_ = 0;
      eVar10._M_value = (uint)path_local.Length;
      eVar10._M_cat = (error_category *)ec._0_8_;
      return eVar10;
    }
    this_00 = llvm::sys::fs::directory_iterator::operator->((directory_iterator *)local_80);
    llvm::sys::fs::directory_entry::path_abi_cxx11_(this_00);
    uVar4 = std::__cxx11::string::data();
    _auStack_f0 = uVar4;
    uVar4 = std::__cxx11::string::length();
    local_e8 = uVar4;
    local_e0 = llvm::sys::path::filename(_auStack_f0,native);
    llvm::StringRef::operator_cast_to_string((string *)local_d0,&local_e0);
    bVar1 = false;
    __end3 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                       ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                        &it.FollowSymlinks);
    pattern.Length =
         (size_t)std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end
                           ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                            &it.FollowSymlinks);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                                       *)&pattern.Length), bVar2) {
      pSVar5 = __gnu_cxx::
               __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
               ::operator*(&__end3);
      pcVar6 = pSVar5->Data;
      pattern.Data = (char *)pSVar5->Length;
      local_120 = pcVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140,pcVar6,&local_141);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,pcVar6,&local_169);
      MVar3 = llbuild::basic::sys::filenameMatch(&local_140,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      if (MVar3 == MATCH) {
        bVar1 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
      ::operator++(&__end3);
    }
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)filters,(value_type *)local_d0);
    }
    std::__cxx11::string::~string((string *)local_d0);
    pdVar7 = llvm::sys::fs::directory_iterator::increment
                       ((directory_iterator *)local_80,(error_code *)&path_local.Length);
    llvm::sys::fs::directory_iterator::operator=((directory_iterator *)local_80,pdVar7);
  } while( true );
}

Assistant:

static std::error_code getFilteredContents(StringRef path, const StringList& filters,
                                  std::vector<std::string>& filenames) {
    auto filterStrings = filters.getValues();

    // Get the list of files in the directory.
    // FIXME: This is not going through the filesystem object. Indeed the fs
    // object does not currently support directory listing/iteration, but
    // probably should so that clients may override it.
    //
    // Exit the loop if we encounter any errors, to prevent infinitely looping
    // over an invalid directory in some circumstances. rdar://101717159
    std::error_code ec;
    for (auto it = llvm::sys::fs::directory_iterator(path, ec),
         end = llvm::sys::fs::directory_iterator(); it != end && !ec;
         it = it.increment(ec)) {
      std::string filename = llvm::sys::path::filename(it->path());
      bool excluded = false;
      for (auto pattern : filterStrings) {
        if (llbuild::basic::sys::filenameMatch(pattern.data(),
                                               filename.c_str()) ==
            llbuild::basic::sys::MATCH) {
          excluded = true;
          break;
        }
      }
      if (!excluded)
        filenames.push_back(filename);
    }

    // Order the filenames.
    std::sort(filenames.begin(), filenames.end(),
              [](const std::string& a, const std::string& b) {
                return a < b;
              });

    return ec;
  }